

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

dtime_t __thiscall
duckdb::Interpolator<false>::Extract<duckdb::dtime_t,duckdb::dtime_t>
          (Interpolator<false> *this,dtime_t *dest,Vector *result)

{
  dtime_t dVar1;
  dtime_t dVar2;
  bool bVar3;
  double dVar4;
  undefined1 auVar5 [16];
  dtime_t result_1;
  dtime_t local_50;
  string local_48;
  
  dVar1 = (dtime_t)dest->micros;
  if (this->CRN == this->FRN) {
    bVar3 = duckdb::TryCast::Operation<duckdb::dtime_t,duckdb::dtime_t>(dVar1,&local_50,false);
    if (!bVar3) {
      auVar5 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::dtime_t,duckdb::dtime_t>
                (&local_48,(duckdb *)dVar1.micros,(dtime_t)auVar5._8_8_);
      duckdb::InvalidInputException::InvalidInputException(auVar5._0_8_,(string *)&local_48);
      __cxa_throw(auVar5._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    bVar3 = duckdb::TryCast::Operation<duckdb::dtime_t,duckdb::dtime_t>(dVar1,&local_50,false);
    dVar2.micros = local_50.micros;
    if (!bVar3) {
      auVar5 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::dtime_t,duckdb::dtime_t>
                (&local_48,(duckdb *)dVar1.micros,(dtime_t)auVar5._8_8_);
      duckdb::InvalidInputException::InvalidInputException(auVar5._0_8_,(string *)&local_48);
      __cxa_throw(auVar5._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    dVar1.micros = dest[1].micros;
    bVar3 = duckdb::TryCast::Operation<duckdb::dtime_t,duckdb::dtime_t>(dVar1,&local_50,false);
    if (!bVar3) {
      auVar5 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::dtime_t,duckdb::dtime_t>
                (&local_48,(duckdb *)dVar1.micros,(dtime_t)auVar5._8_8_);
      duckdb::InvalidInputException::InvalidInputException(auVar5._0_8_,(string *)&local_48);
      __cxa_throw(auVar5._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    dVar4 = this->RN -
            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0));
    local_50.micros =
         llround(dVar4 * (double)local_50.micros + (1.0 - dVar4) * (double)dVar2.micros);
  }
  return (dtime_t)local_50.micros;
}

Assistant:

inline TARGET_TYPE Extract(const INPUT_TYPE *dest, Vector &result) const {
		if (CRN == FRN) {
			return CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
		} else {
			auto lo = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
			auto hi = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[1], result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}